

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

BOOL __thiscall
Memory::Recycler::TryFinishConcurrentCollect<(Memory::CollectionFlags)270602243>(Recycler *this)

{
  size_t *psVar1;
  uint uVar2;
  ulong uVar3;
  code *pcVar4;
  bool bVar5;
  DWORD DVar6;
  BOOL BVar7;
  DWORD DVar8;
  undefined4 *puVar9;
  
  if ((this->collectionState).value == CollectionStateNotCollecting) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x122b,"(this->CollectionInProgress())","this->CollectionInProgress()");
    if (!bVar5) goto LAB_00690ac1;
    *puVar9 = 0;
  }
  psVar1 = &(this->collectionStats).finishCollectTryCount;
  *psVar1 = *psVar1 + 1;
  SetupPostCollectionFlags<(Memory::CollectionFlags)270602243>(this);
  if (((this->enableConcurrentMark == false) && (this->enableParallelMark == false)) &&
     (this->enableConcurrentSweep == false)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1233,"(this->IsConcurrentEnabled())","this->IsConcurrentEnabled()");
    if (!bVar5) goto LAB_00690ac1;
    *puVar9 = 0;
  }
  if ((((this->collectionState).value & Collection_Concurrent) == CollectionStateNotCollecting) &&
     (this->isCollectionDisabled == false)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1234,"(IsConcurrentState() || IsCollectionDisabled())",
                       "IsConcurrentState() || IsCollectionDisabled()");
    if (!bVar5) {
LAB_00690ac1:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar9 = 0;
  }
  if (this->concurrentThread == (HANDLE)0x0) {
LAB_006909d0:
    BVar7 = FinishConcurrentCollectWrapped
                      (this,CollectMode_Concurrent|CollectOverride_FinishConcurrentTimeout|
                            CollectOverride_AllowReentrant|CollectBackgroundStress|
                            CollectHeuristic_Time|CollectHeuristic_AllocSize);
    return BVar7;
  }
  if (((this->collectionState).value & Collection_ExecutingConcurrent) ==
      CollectionStateNotCollecting) {
    DVar6 = GetTickCount();
    if (this->tickCountNextFinishCollection < DVar6) goto LAB_006909d0;
  }
  else if (this->priorityBoost == false) {
    DVar6 = GetTickCount();
    if (((this->autoHeap).uncollectedAllocBytes <=
         RecyclerHeuristic::Instance.UncollectedAllocBytesConcurrentPriorityBoost) &&
       (uVar2 = this->tickCountStartConcurrent,
       DVar8 = RecyclerHeuristic::PriorityBoostTimeout(this->recyclerFlagsTable),
       DVar6 - uVar2 <= DVar8)) {
      return 0;
    }
    bVar5 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,RecyclerPhase);
    if (bVar5) {
      Output::Print(L"%04X> RC(%p): %s: ",this->mainThreadId,this,L"Set priority normal");
      uVar3 = (this->autoHeap).uncollectedAllocBytes;
      if (RecyclerHeuristic::Instance.UncollectedAllocBytesConcurrentPriorityBoost < uVar3) {
        Output::Print(L"AllocBytes=%d (Time=%d)\n",uVar3,
                      (ulong)(DVar6 - this->tickCountStartConcurrent));
      }
      else {
        Output::Print(L"Time=%d (AllocBytes=%d\n");
      }
    }
    this->priorityBoost = true;
    SetThreadPriority(this->concurrentThread,0);
  }
  return 0;
}

Assistant:

BOOL
Recycler::TryFinishConcurrentCollect()
{
    Assert(this->CollectionInProgress());

    RECYCLER_STATS_INC(this, finishCollectTryCount);

    SetupPostCollectionFlags<flags>();
    const BOOL concurrent = flags & CollectMode_Concurrent;
    const BOOL forceInThread = flags & CollectOverride_ForceInThread;

    Assert(this->IsConcurrentEnabled());
    Assert(IsConcurrentState() || IsCollectionDisabled());
    Assert(!concurrent || !forceInThread);
    if (concurrent && concurrentThread != NULL)
    {
        if (IsConcurrentExecutingState())
        {
            if (!this->priorityBoost)
            {
                uint tickCount = GetTickCount();
                if ((autoHeap.uncollectedAllocBytes > RecyclerHeuristic::Instance.UncollectedAllocBytesConcurrentPriorityBoost)
                    || (tickCount - this->tickCountStartConcurrent > RecyclerHeuristic::PriorityBoostTimeout(this->GetRecyclerFlagsTable())))
                {

    #ifdef RECYCLER_TRACE
                    if (GetRecyclerFlagsTable().Trace.IsEnabled(Js::RecyclerPhase))
                    {
                        Output::Print(_u("%04X> RC(%p): %s: "), this->mainThreadId, this, _u("Set priority normal"));
                        if (autoHeap.uncollectedAllocBytes > RecyclerHeuristic::Instance.UncollectedAllocBytesConcurrentPriorityBoost)
                        {
                            Output::Print(_u("AllocBytes=%d (Time=%d)\n"), autoHeap.uncollectedAllocBytes, tickCount - this->tickCountStartConcurrent);
                        }
                        else
                        {
                            Output::Print(_u("Time=%d (AllocBytes=%d\n"), tickCount - this->tickCountStartConcurrent, autoHeap.uncollectedAllocBytes);
                        }
                    }
    #endif
                    // Set it to a large number so we don't set the thread priority again
                    this->priorityBoost = true;

                    // The recycler thread hasn't come back in 5 seconds
                    // It either has a large object graph, or it is starving.
                    // Set the priority back to normal
                    SetThreadPriority(this->concurrentThread, THREAD_PRIORITY_NORMAL);
                }
            }

            return FinishDisposeObjectsWrapped<flags>();
        }
        else if ((flags & CollectOverride_FinishConcurrentTimeout) != 0)
        {
            uint tickCount = GetTickCount();

            // If we haven't gone past the time to call finish collection,
            // simply call FinishDisposeObjects and return
            // Otherwise, actually go ahead and call FinishConcurrentCollectWrapped
            // We do this only if this is a collection that allows finish concurrent to timeout
            // If not, by default, we finish the collection
            if (tickCount <= this->tickCountNextFinishCollection)
            {
                return FinishDisposeObjectsWrapped<flags>();
            }
        }
    }

    return FinishConcurrentCollectWrapped(flags);
}